

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_ParseWithOpts(char *value,char **return_parse_end,cJSON_bool require_null_terminated)

{
  long lVar1;
  char *pcVar2;
  cJSON_bool cVar3;
  size_t sVar4;
  cJSON *item;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  long in_FS_OFFSET;
  parse_buffer local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  item = (cJSON *)0x0;
  local_70.depth = 0;
  global_error_0 = (char *)0x0;
  global_error_1 = 0;
  if (value == (char *)0x0) goto LAB_00102504;
  local_70.content = (uchar *)value;
  sVar4 = strlen(value);
  sVar8 = sVar4 + 1;
  local_70.offset = 0;
  local_70.hooks.allocate._0_4_ = global_hooks.allocate._0_4_;
  local_70.hooks.allocate._4_4_ = global_hooks.allocate._4_4_;
  local_70.hooks.deallocate._0_4_ = global_hooks.deallocate._0_4_;
  local_70.hooks.deallocate._4_4_ = global_hooks.deallocate._4_4_;
  local_70.hooks.reallocate = global_hooks.reallocate;
  local_70.length = sVar8;
  item = (cJSON *)(*(code *)CONCAT44(global_hooks.allocate._4_4_,global_hooks.allocate._0_4_))(0x40)
  ;
  if (item == (cJSON *)0x0) {
    sVar4 = 0;
  }
  else {
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    if (sVar8 == 0) {
      sVar5 = 0;
    }
    else if ((byte)*value < 0x21) {
      sVar7 = 0;
      do {
        sVar5 = sVar7 + 1;
        if (sVar4 == sVar7) goto LAB_00102460;
        lVar1 = sVar7 + 1;
        sVar7 = sVar5;
        local_70.offset = sVar5;
      } while ((byte)value[lVar1] < 0x21);
    }
    else {
      sVar5 = 0;
    }
    if (sVar5 != sVar8) {
      sVar4 = local_70.offset;
    }
LAB_00102460:
    local_70.offset = sVar4;
    cVar3 = parse_value(item,&local_70);
    if (cVar3 != 0) {
      if (require_null_terminated != 0) {
        if (local_70.content != (uchar *)0x0) {
          if (local_70.offset < local_70.length) {
            do {
              if (0x20 < local_70.content[local_70.offset]) goto LAB_001024a7;
              local_70.offset = local_70.offset + 1;
            } while (local_70.length != local_70.offset);
          }
          else {
LAB_001024a7:
            if (local_70.offset != local_70.length) goto LAB_001024b5;
          }
          local_70.offset = local_70.length - 1;
        }
LAB_001024b5:
        if ((local_70.length <= local_70.offset) || (local_70.content[local_70.offset] != '\0'))
        goto LAB_001024c0;
      }
      if (return_parse_end != (char **)0x0) {
        *return_parse_end = (char *)(local_70.content + local_70.offset);
      }
      goto LAB_00102504;
    }
LAB_001024c0:
    cJSON_Delete(item);
    sVar4 = local_70.offset;
    sVar8 = local_70.length;
  }
  uVar6 = 0;
  if (sVar8 != 0) {
    uVar6 = sVar8 - 1;
  }
  if (sVar4 < sVar8) {
    uVar6 = sVar4;
  }
  pcVar2 = value;
  if (return_parse_end != (char **)0x0) {
    *return_parse_end = value + uVar6;
    pcVar2 = global_error_0;
    uVar6 = global_error_1;
  }
  global_error_1 = uVar6;
  global_error_0 = pcVar2;
  item = (cJSON *)0x0;
LAB_00102504:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_ParseWithOpts(const char *value, const char **return_parse_end, cJSON_bool require_null_terminated)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    cJSON *item = NULL;

    /* reset error position */
    global_error.json = NULL;
    global_error.position = 0;

    if (value == NULL)
    {
        goto fail;
    }

    buffer.content = (const unsigned char*)value;
    buffer.length = strlen((const char*)value) + sizeof("");
    buffer.offset = 0;
    buffer.hooks = global_hooks;

    item = cJSON_New_Item(&global_hooks);
    if (item == NULL) /* memory fail */
    {
        goto fail;
    }

    if (!parse_value(item, buffer_skip_whitespace(&buffer)))
    {
        /* parse failure. ep is set. */
        goto fail;
    }

    /* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
    if (require_null_terminated)
    {
        buffer_skip_whitespace(&buffer);
        if ((buffer.offset >= buffer.length) || buffer_at_offset(&buffer)[0] != '\0')
        {
            goto fail;
        }
    }
    if (return_parse_end)
    {
        *return_parse_end = (const char*)buffer_at_offset(&buffer);
    }

    return item;

fail:
    if (item != NULL)
    {
        cJSON_Delete(item);
    }

    if (value != NULL)
    {
        error local_error;
        local_error.json = (const unsigned char*)value;
        local_error.position = 0;

        if (buffer.offset < buffer.length)
        {
            local_error.position = buffer.offset;
        }
        else if (buffer.length > 0)
        {
            local_error.position = buffer.length - 1;
        }

        if (return_parse_end != NULL)
        {
            *return_parse_end = (const char*)local_error.json + local_error.position;
        }
        else
        {
            global_error = local_error;
        }
    }

    return NULL;
}